

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlHandle __thiscall despot::util::tinyxml::TiXmlHandle::Child(TiXmlHandle *this,int count)

{
  TiXmlNode **ppTVar1;
  TiXmlNode *pTVar2;
  int in_EDX;
  int iVar3;
  undefined4 in_register_00000034;
  
  if (*(long *)CONCAT44(in_register_00000034,count) != 0) {
    ppTVar1 = (TiXmlNode **)(*(long *)CONCAT44(in_register_00000034,count) + 0x28);
    for (iVar3 = 0; (pTVar2 = *ppTVar1, pTVar2 != (TiXmlNode *)0x0 && (iVar3 < in_EDX));
        iVar3 = iVar3 + 1) {
      ppTVar1 = &pTVar2->next;
    }
    if (pTVar2 != (TiXmlNode *)0x0) goto LAB_00178e96;
  }
  pTVar2 = (TiXmlNode *)0x0;
LAB_00178e96:
  this->node = pTVar2;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::Child(int count) const {
	if (node) {
		int i;
		TiXmlNode* child = node->FirstChild();
		for (i = 0; child && i < count; child = child->NextSibling(), ++i) {
			// nothing
		}
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}